

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyBlobReset(SyBlob *pBlob)

{
  uint uVar1;
  
  pBlob->nByte = 0;
  uVar1 = pBlob->nFlags;
  if ((uVar1 & 4) != 0) {
    pBlob->pBlob = (void *)0x0;
    pBlob->mByte = 0;
    uVar1 = uVar1 & 0xfffffffb;
    pBlob->nFlags = uVar1;
  }
  return uVar1;
}

Assistant:

JX9_PRIVATE sxi32 SyBlobReset(SyBlob *pBlob)
{
	pBlob->nByte = 0;
	if( pBlob->nFlags & SXBLOB_RDONLY ){
		/* Read-only (Not malloced chunk) */
		pBlob->pBlob = 0;
		pBlob->mByte = 0;
		pBlob->nFlags &= ~SXBLOB_RDONLY;
	}
	return SXRET_OK;
}